

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_async_function_resolve_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  long lVar1;
  JSValue v;
  JSValue JVar2;
  int iVar3;
  long in_RSI;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar4;
  JSValueUnion *in_stack_00000008;
  JSValue arg;
  BOOL is_reject;
  JSAsyncFunctionData *s;
  JSObject *p;
  undefined4 in_stack_00000078;
  JSValue in_stack_ffffffffffffff58;
  uint uStack_74;
  JSValueUnion local_68;
  void *local_60;
  uint uStack_c;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  iVar3 = *(ushort *)(in_RSI + 6) - 0x2e;
  if (in_R9D < 1) {
    local_68.ptr = (void *)((ulong)uStack_74 << 0x20);
    local_60 = (void *)0x3;
  }
  else {
    local_68 = (JSValueUnion)in_stack_00000008->ptr;
    local_60 = in_stack_00000008[1].ptr;
  }
  *(int *)(lVar1 + 0x54) = iVar3;
  if (iVar3 == 0) {
    lVar1 = *(long *)(lVar1 + 0xa0);
    JVar4.tag = (int64_t)local_60;
    JVar4.u.ptr = local_68.ptr;
    JVar4 = JS_DupValue(in_RDI,JVar4);
    *(JSValueUnion *)(lVar1 + -0x10) = JVar4.u;
    *(int64_t *)(lVar1 + -8) = JVar4.tag;
  }
  else {
    v.tag = (int64_t)local_60;
    v.u.ptr = local_68.ptr;
    JS_DupValue(in_RDI,v);
    JS_Throw(in_RDI,in_stack_ffffffffffffff58);
  }
  js_async_function_resume(ctx,(JSAsyncFunctionData *)CONCAT44(argc,in_stack_00000078));
  JVar2.tag = 3;
  JVar2.u.ptr = (void *)((ulong)uStack_c << 0x20);
  return JVar2;
}

Assistant:

static JSValue js_async_function_resolve_call(JSContext *ctx,
                                              JSValueConst func_obj,
                                              JSValueConst this_obj,
                                              int argc, JSValueConst *argv,
                                              int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSAsyncFunctionData *s = p->u.async_function_data;
    BOOL is_reject = p->class_id - JS_CLASS_ASYNC_FUNCTION_RESOLVE;
    JSValueConst arg;

    if (argc > 0)
        arg = argv[0];
    else
        arg = JS_UNDEFINED;
    s->func_state.throw_flag = is_reject;
    if (is_reject) {
        JS_Throw(ctx, JS_DupValue(ctx, arg));
    } else {
        /* return value of await */
        s->func_state.frame.cur_sp[-1] = JS_DupValue(ctx, arg);
    }
    js_async_function_resume(ctx, s);
    return JS_UNDEFINED;
}